

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_throughput(config config)

{
  redisContext *c;
  undefined8 uVar1;
  void *pvVar2;
  longlong lVar3;
  int *piVar4;
  longlong lVar5;
  long lVar6;
  int iVar7;
  config *pcVar8;
  undefined8 *puVar9;
  bool bVar10;
  config in_stack_ffffffffffffff78;
  
  pcVar8 = &config;
  puVar9 = (undefined8 *)&stack0xffffffffffffff78;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *(undefined8 *)pcVar8;
    pcVar8 = (config *)&pcVar8->tcp;
    puVar9 = puVar9 + 1;
  }
  c = do_connect(in_stack_ffffffffffffff78);
  tests = tests + 1;
  printf("#%02d ");
  puts("Throughput:");
  iVar7 = 500;
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    uVar1 = redisCommand(c,"LPUSH mylist foo");
    freeReplyObject(uVar1);
  }
  pvVar2 = malloc(8000);
  lVar3 = usec();
  lVar6 = 0;
  do {
    if (lVar6 == 1000) {
      lVar5 = usec();
      for (lVar6 = 0; lVar6 != 1000; lVar6 = lVar6 + 1) {
        freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
      }
      free(pvVar2);
      printf("\t(%dx PING: %.3fs)\n",(double)(lVar5 - lVar3) / 1000000.0,1000);
      pvVar2 = malloc(8000);
      lVar3 = usec();
      lVar6 = 0;
      while( true ) {
        if (lVar6 == 1000) {
          lVar5 = usec();
          for (lVar6 = 0; lVar6 != 1000; lVar6 = lVar6 + 1) {
            freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
          }
          free(pvVar2);
          printf("\t(%dx LRANGE with 500 elements: %.3fs)\n",(double)(lVar5 - lVar3) / 1000000.0,
                 1000);
          pvVar2 = malloc(8000);
          lVar3 = usec();
          lVar6 = 0;
          do {
            if (lVar6 == 1000) {
              lVar5 = usec();
              for (lVar6 = 0; lVar6 != 1000; lVar6 = lVar6 + 1) {
                freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
              }
              free(pvVar2);
              printf("\t(%dx INCRBY: %.3fs)\n",(double)(lVar5 - lVar3) / 1000000.0,1000);
              pvVar2 = malloc(80000);
              iVar7 = 10000;
              while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
                redisAppendCommand(c,"PING");
              }
              lVar6 = 0;
              lVar3 = usec();
              do {
                if (lVar6 == 80000) {
                  lVar5 = usec();
                  for (lVar6 = 0; lVar6 != 10000; lVar6 = lVar6 + 1) {
                    freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
                  }
                  free(pvVar2);
                  iVar7 = 10000;
                  printf("\t(%dx PING (pipelined): %.3fs)\n",(double)(lVar5 - lVar3) / 1000000.0,
                         10000);
                  pvVar2 = malloc(80000);
                  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
                    redisAppendCommand(c,"LRANGE mylist 0 499");
                  }
                  lVar6 = 0;
                  lVar3 = usec();
                  while( true ) {
                    if (lVar6 == 80000) {
                      lVar5 = usec();
                      for (lVar6 = 0; lVar6 != 10000; lVar6 = lVar6 + 1) {
                        freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
                      }
                      free(pvVar2);
                      iVar7 = 10000;
                      printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n",
                             (double)(lVar5 - lVar3) / 1000000.0,10000);
                      pvVar2 = malloc(80000);
                      while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
                        redisAppendCommand(c,"INCRBY incrkey %d",1000000);
                      }
                      lVar6 = 0;
                      lVar3 = usec();
                      while( true ) {
                        if (lVar6 == 80000) {
                          lVar5 = usec();
                          for (lVar6 = 0; lVar6 != 10000; lVar6 = lVar6 + 1) {
                            freeReplyObject(*(undefined8 *)((long)pvVar2 + lVar6 * 8));
                          }
                          free(pvVar2);
                          printf("\t(%dx INCRBY (pipelined): %.3fs)\n",
                                 (double)(lVar5 - lVar3) / 1000000.0);
                          disconnect(c,0);
                          return;
                        }
                        iVar7 = redisGetReply(c,(undefined8 *)((long)pvVar2 + lVar6));
                        if (iVar7 != 0) break;
                        piVar4 = *(int **)((long)pvVar2 + lVar6);
                        if ((piVar4 == (int *)0x0) || (lVar6 = lVar6 + 8, *piVar4 != 3)) {
                          __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                        ,0x31e,"void test_throughput(struct config)");
                        }
                      }
                      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x31d,"void test_throughput(struct config)");
                    }
                    iVar7 = redisGetReply(c,(undefined8 *)((long)pvVar2 + lVar6));
                    if (iVar7 != 0) {
                      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x30f,"void test_throughput(struct config)");
                    }
                    piVar4 = *(int **)((long)pvVar2 + lVar6);
                    if ((piVar4 == (int *)0x0) || (*piVar4 != 2)) break;
                    lVar6 = lVar6 + 8;
                    if (*(long *)(piVar4 + 10) != 500) {
                      __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x311,"void test_throughput(struct config)");
                    }
                  }
                  __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                ,0x310,"void test_throughput(struct config)");
                }
                iVar7 = redisGetReply(c,(undefined8 *)((long)pvVar2 + lVar6));
                if (iVar7 != 0) {
                  __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                ,0x302,"void test_throughput(struct config)");
                }
                piVar4 = *(int **)((long)pvVar2 + lVar6);
              } while ((piVar4 != (int *)0x0) && (lVar6 = lVar6 + 8, *piVar4 == 5));
              __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                            ,0x303,"void test_throughput(struct config)");
            }
            piVar4 = (int *)redisCommand(c,"INCRBY incrkey %d",1000000);
            *(int **)((long)pvVar2 + lVar6 * 8) = piVar4;
          } while ((piVar4 != (int *)0x0) && (lVar6 = lVar6 + 1, *piVar4 == 3));
          __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                        ,0x2f5,"void test_throughput(struct config)");
        }
        piVar4 = (int *)redisCommand(c,"LRANGE mylist 0 499");
        *(int **)((long)pvVar2 + lVar6 * 8) = piVar4;
        if ((piVar4 == (int *)0x0) || (*piVar4 != 2)) break;
        lVar6 = lVar6 + 1;
        if (*(long *)(piVar4 + 10) != 500) {
          __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                        ,0x2ea,"void test_throughput(struct config)");
        }
      }
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2e9,"void test_throughput(struct config)");
    }
    piVar4 = (int *)redisCommand(c,"PING");
    *(int **)((long)pvVar2 + lVar6 * 8) = piVar4;
  } while ((piVar4 != (int *)0x0) && (lVar6 = lVar6 + 1, *piVar4 == 5));
  __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                ,0x2de,"void test_throughput(struct config)");
}

Assistant:

static void test_throughput(struct config config) {
    redisContext *c = do_connect(config);
    redisReply **replies;
    int i, num;
    long long t1, t2;

    test("Throughput:\n");
    for (i = 0; i < 500; i++)
        freeReplyObject(redisCommand(c,"LPUSH mylist foo"));

    num = 1000;
    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"PING");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"LRANGE mylist 0 499");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c, "INCRBY incrkey %d", 1000000);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY: %.3fs)\n", num, (t2-t1)/1000000.0);

    num = 10000;
    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"PING");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"LRANGE mylist 0 499");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"INCRBY incrkey %d", 1000000);
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    disconnect(c, 0);
}